

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

void duckdb::EquiWidthBinFunction<duckdb::timestamp_t,duckdb::EquiWidthBinsTimestamp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  timestamp_t input_min;
  timestamp_t input_max;
  ulong bin_count;
  Expression *pEVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  UnifiedVectorFormat *pUVar10;
  reference pvVar11;
  InvalidInputException *pIVar12;
  UnifiedVectorFormat *pUVar13;
  UnifiedVectorFormat *pUVar14;
  UnifiedVectorFormat *pUVar15;
  UnifiedVectorFormat *pUVar16;
  UnifiedVectorFormat *i;
  bool bVar17;
  GenericListType<duckdb::PrimitiveType<duckdb::timestamp_t>_> result_bins;
  _Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
  local_200;
  _Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
  local_1e8;
  LogicalType local_1d0 [24];
  STRUCT_STATE a_state;
  STRUCT_STATE d_state;
  STRUCT_STATE c_state;
  STRUCT_STATE b_state;
  Vector intermediate_result;
  
  pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  pvVar7 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  pvVar8 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,2);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,3);
  duckdb::LogicalType::LogicalType((LogicalType *)&a_state,TIMESTAMP);
  duckdb::LogicalType::LIST(local_1d0);
  duckdb::Vector::Vector(&intermediate_result,local_1d0,0x800);
  duckdb::LogicalType::~LogicalType(local_1d0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&a_state);
  bVar17 = false;
  if (((*pvVar6 == (value_type)0x2) && (*pvVar7 == (value_type)0x2)) && (*pvVar8 == (value_type)0x2)
     ) {
    bVar17 = *pvVar9 == (value_type)0x2;
  }
  pUVar16 = *(UnifiedVectorFormat **)(args + 0x18);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&a_state.main_data);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&b_state.main_data);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&c_state.main_data);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&d_state.main_data);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,pUVar16);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,pUVar16);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,pUVar16);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar16);
  if (bVar17) {
    pUVar16 = (UnifiedVectorFormat *)0x1;
  }
  i = (UnifiedVectorFormat *)0x0;
  do {
    if (pUVar16 == i) {
      if (bVar17) {
        duckdb::Vector::SetVectorType((VectorType)&intermediate_result);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&d_state.main_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&c_state.main_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&b_state.main_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&a_state.main_data);
      duckdb::VectorOperations::DefaultCast
                (&intermediate_result,result,*(ulong *)(args + 0x18),false);
      Vector::~Vector(&intermediate_result);
      return;
    }
    lVar1 = *(long *)a_state._0_8_;
    pUVar14 = i;
    if (lVar1 != 0) {
      pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar1 + (long)i * 4);
    }
    lVar2 = *(long *)b_state._0_8_;
    pUVar10 = i;
    if (lVar2 != 0) {
      pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar2 + (long)i * 4);
    }
    lVar3 = *(long *)c_state._0_8_;
    pUVar13 = i;
    if (lVar3 != 0) {
      pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)i * 4);
    }
    lVar4 = *(long *)d_state._0_8_;
    pUVar15 = i;
    if (lVar4 != 0) {
      pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)i * 4);
    }
    if (((((a_state._16_8_ == 0) ||
          ((*(ulong *)(a_state._16_8_ + ((ulong)pUVar14 >> 6) * 8) >> ((ulong)pUVar14 & 0x3f) & 1)
           != 0)) &&
         ((b_state._16_8_ == 0 ||
          ((*(ulong *)(b_state._16_8_ + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1)
           != 0)))) &&
        ((c_state._16_8_ == 0 ||
         ((*(ulong *)(c_state._16_8_ + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1) !=
          0)))) &&
       ((d_state._16_8_ == 0 ||
        ((*(ulong *)(d_state._16_8_ + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) !=
         0)))) {
      pUVar14 = i;
      if (lVar1 != 0) {
        pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar1 + (long)i * 4);
      }
      pUVar10 = i;
      if (lVar2 != 0) {
        pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar2 + (long)i * 4);
      }
      pUVar13 = i;
      if (lVar3 != 0) {
        pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)i * 4);
      }
      pUVar15 = i;
      if (lVar4 != 0) {
        pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)i * 4);
      }
      input_min.value = *(int64_t *)(a_state._8_8_ + (long)pUVar14 * 8);
      input_max.value = *(int64_t *)(b_state._8_8_ + (long)pUVar10 * 8);
      if (input_max.value < input_min.value) {
        pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar5 = *(Expression **)(state + 8);
        std::__cxx11::string::string
                  ((string *)&result_bins,
                   "Invalid input for bin function - max value is smaller than min value",
                   (allocator *)&local_200);
        InvalidInputException::InvalidInputException<>(pIVar12,pEVar5,(string *)&result_bins);
        __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      bin_count = *(ulong *)(c_state._8_8_ + (long)pUVar13 * 8);
      if ((long)bin_count < 1) {
        pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar5 = *(Expression **)(state + 8);
        std::__cxx11::string::string
                  ((string *)&result_bins,"Invalid input for bin function - there must be > 0 bins",
                   (allocator *)&local_200);
        InvalidInputException::InvalidInputException<>(pIVar12,pEVar5,(string *)&result_bins);
        __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (1000000 < bin_count) {
        pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar5 = *(Expression **)(state + 8);
        std::__cxx11::string::string
                  ((string *)&result_bins,
                   "Invalid input for bin function - max bin count of %d exceeded",
                   (allocator *)&local_200);
        InvalidInputException::InvalidInputException<long>
                  (pIVar12,pEVar5,(string *)&result_bins,1000000);
        __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      result_bins.values.
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      .
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      .
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      .
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (input_max.value == input_min.value) {
        local_200._M_impl.super__Vector_impl_data._M_start = (pointer)input_min.value;
        std::
        vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
        ::emplace_back<duckdb::PrimitiveType<duckdb::timestamp_t>>
                  ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
                    *)&result_bins,(PrimitiveType<duckdb::timestamp_t> *)&local_200);
      }
      else {
        EquiWidthBinsTimestamp::Operation
                  ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *)&local_200,
                   *(Expression **)(state + 8),input_min,input_max,bin_count,
                   (bool)pUVar15[d_state._8_8_]);
        std::
        vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ::_M_move_assign((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                          *)&result_bins);
        std::
        _Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ::~_Vector_base(&local_200);
        pvVar11 = vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true>::get<true>
                            ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *)
                             &result_bins,0);
        if ((pvVar11->val).value < input_max.value) {
          pvVar11 = vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true>::get<true>
                              ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *)
                               &result_bins,0);
          (pvVar11->val).value = input_max.value;
        }
        std::
        __reverse<__gnu_cxx::__normal_iterator<duckdb::PrimitiveType<duckdb::timestamp_t>*,std::vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>>>
                  (result_bins.values.
                   super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   .
                   super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   result_bins.values.
                   super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   .
                   super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_1e8._M_impl.super__Vector_impl_data._M_start =
           result_bins.values.
           super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1e8._M_impl.super__Vector_impl_data._M_finish =
           result_bins.values.
           super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage =
           result_bins.values.
           super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      .
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      .
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result_bins.values.
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      .
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ::~_Vector_base((_Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                       *)&result_bins);
      GenericListType<duckdb::PrimitiveType<duckdb::timestamp_t>_>::AssignResult
                (&intermediate_result,(idx_t)i,
                 (GenericListType<duckdb::PrimitiveType<duckdb::timestamp_t>_> *)&local_1e8);
      std::
      _Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ::~_Vector_base(&local_1e8);
    }
    else {
      duckdb::FlatVector::SetNull(&intermediate_result,(ulong)i,true);
    }
    i = i + 1;
  } while( true );
}

Assistant:

static void EquiWidthBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	static constexpr int64_t MAX_BIN_COUNT = 1000000;
	auto &min_arg = args.data[0];
	auto &max_arg = args.data[1];
	auto &bin_count = args.data[2];
	auto &nice_rounding = args.data[3];

	Vector intermediate_result(LogicalType::LIST(OP::LOGICAL_TYPE));
	GenericExecutor::ExecuteQuaternary<PrimitiveType<T>, PrimitiveType<T>, PrimitiveType<int64_t>, PrimitiveType<bool>,
	                                   GenericListType<PrimitiveType<T>>>(
	    min_arg, max_arg, bin_count, nice_rounding, intermediate_result, args.size(),
	    [&](PrimitiveType<T> min_p, PrimitiveType<T> max_p, PrimitiveType<int64_t> bins_p,
	        PrimitiveType<bool> nice_rounding_p) {
		    if (max_p.val < min_p.val) {
			    throw InvalidInputException(state.expr,
			                                "Invalid input for bin function - max value is smaller than min value");
		    }
		    if (bins_p.val <= 0) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - there must be > 0 bins");
		    }
		    if (bins_p.val > MAX_BIN_COUNT) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - max bin count of %d exceeded",
			                                MAX_BIN_COUNT);
		    }
		    GenericListType<PrimitiveType<T>> result_bins;
		    if (max_p.val == min_p.val) {
			    // if max = min return a single bucket
			    result_bins.values.push_back(max_p.val);
		    } else {
			    result_bins.values = OP::Operation(state.expr, min_p.val, max_p.val, static_cast<idx_t>(bins_p.val),
			                                       nice_rounding_p.val);
			    // last bin should always be the input max
			    if (result_bins.values[0].val < max_p.val) {
				    result_bins.values[0].val = max_p.val;
			    }
			    std::reverse(result_bins.values.begin(), result_bins.values.end());
		    }
		    return result_bins;
	    });
	VectorOperations::DefaultCast(intermediate_result, result, args.size());
}